

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O3

size_t sp_seg(converter_desc *converter,ucs4_t **inbuf,size_t *inbuf_left,ucs4_t **outbuf,
             size_t *outbuf_left,size_t length)

{
  size_t sVar1;
  opencc_conversion_mode oVar2;
  size_t *psVar3;
  undefined1 auVar4 [16];
  ucs4_t **ppuVar5;
  size_t sVar6;
  size_t sVar7;
  ucs4_t *puVar8;
  ucs4_t *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  ucs4_t *puVar13;
  ucs4_t uVar14;
  size_t *psVar15;
  size_t *psVar16;
  long lVar17;
  long lVar18;
  size_t sVar19;
  size_t sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  size_t match_len;
  size_t local_48;
  size_t *local_40;
  ucs4_t **local_38;
  
  if (length == 1) {
    ppuVar5 = dictionary_group_match_longest
                        (converter->current_dictionary_group,*inbuf,1,(size_t *)0x0);
    oVar2 = converter->conversion_mode;
    if (oVar2 == OPENCC_CONVERSION_LIST_CANDIDATES) {
      if (ppuVar5 == (ucs4_t **)0x0) {
        puVar13 = *outbuf;
        *puVar13 = **inbuf;
        *outbuf = puVar13 + 1;
        *outbuf_left = *outbuf_left - 1;
      }
      else {
        puVar13 = *ppuVar5;
        if (puVar13 != (ucs4_t *)0x0) {
          lVar18 = 0;
          do {
            puVar9 = ppuVar5[lVar18 + 1];
            sVar6 = ucs4len(puVar13);
            uVar11 = *outbuf_left;
            if (uVar11 < (sVar6 + 1) - (ulong)(puVar9 == (ucs4_t *)0x0)) {
              errnum = CONVERTER_ERROR_OUTBUF;
              return 0xffffffffffffffff;
            }
            uVar14 = *puVar13;
            if (uVar14 != 0) {
              puVar8 = *outbuf;
              do {
                puVar13 = puVar13 + 1;
                *puVar8 = uVar14;
                puVar8 = puVar8 + 1;
                uVar11 = uVar11 - 1;
                uVar14 = *puVar13;
              } while (uVar14 != 0);
              *outbuf = puVar8;
              *outbuf_left = uVar11;
            }
            if (puVar9 != (ucs4_t *)0x0) {
              puVar13 = *outbuf;
              *puVar13 = 0x20;
              *outbuf = puVar13 + 1;
              *outbuf_left = uVar11 - 1;
            }
            lVar18 = lVar18 + 1;
            puVar13 = ppuVar5[lVar18];
          } while (puVar13 != (ucs4_t *)0x0);
        }
      }
    }
    else {
      if (oVar2 == OPENCC_CONVERSION_SEGMENT_ONLY) {
        if (ppuVar5 == (ucs4_t **)0x0) {
          puVar13 = *outbuf;
          *puVar13 = **inbuf;
          *outbuf = puVar13 + 1;
          uVar11 = *outbuf_left;
        }
        else {
          uVar11 = *outbuf_left;
          if (uVar11 < 2) {
            errnum = CONVERTER_ERROR_OUTBUF;
            return 0xffffffffffffffff;
          }
          puVar13 = *outbuf;
          *puVar13 = **inbuf;
          *outbuf = puVar13 + 1;
        }
        *outbuf_left = uVar11 - 1;
        *inbuf = *inbuf + 1;
        *inbuf_left = *inbuf_left - 1;
        puVar13 = *outbuf;
        *puVar13 = 0x20;
        *outbuf = puVar13 + 1;
        *outbuf_left = *outbuf_left - 1;
        return 1;
      }
      if (oVar2 != OPENCC_CONVERSION_FAST) {
LAB_0010420a:
        sp_seg_cold_2();
        puVar10 = (undefined8 *)malloc(0x408);
        *puVar10 = 0;
        return (size_t)puVar10;
      }
      if (ppuVar5 == (ucs4_t **)0x0) {
        puVar13 = *outbuf;
        *puVar13 = **inbuf;
        *outbuf = puVar13 + 1;
        *outbuf_left = *outbuf_left - 1;
      }
      else {
        puVar13 = *ppuVar5;
        sVar6 = ucs4len(puVar13);
        uVar11 = *outbuf_left;
        if (uVar11 < sVar6) {
          errnum = CONVERTER_ERROR_OUTBUF;
          return 0xffffffffffffffff;
        }
        uVar14 = *puVar13;
        if (uVar14 != 0) {
          puVar9 = *outbuf;
          do {
            puVar13 = puVar13 + 1;
            *puVar9 = uVar14;
            puVar9 = puVar9 + 1;
            uVar11 = uVar11 - 1;
            uVar14 = *puVar13;
          } while (uVar14 != 0);
          *outbuf = puVar9;
          *outbuf_left = uVar11;
        }
      }
    }
    *inbuf = *inbuf + 1;
    *inbuf_left = *inbuf_left - 1;
    return 1;
  }
  uVar11 = length + 1;
  if (((converter->spseg_buffer).initialized == 0) ||
     ((converter->spseg_buffer).buffer_size < uVar11)) {
    sp_seg_set_buffer_size(&converter->spseg_buffer,uVar11);
  }
  auVar4 = _DAT_00105230;
  lVar18 = uVar11 + (uVar11 == 0);
  psVar15 = (converter->spseg_buffer).min_len;
  lVar17 = lVar18 + -1;
  auVar21._8_4_ = (int)lVar17;
  auVar21._0_8_ = lVar17;
  auVar21._12_4_ = (int)((ulong)lVar17 >> 0x20);
  uVar11 = 0;
  auVar21 = auVar21 ^ _DAT_00105230;
  auVar22 = _DAT_00105220;
  do {
    auVar23 = auVar22 ^ auVar4;
    if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                auVar21._4_4_ < auVar23._4_4_) & 1)) {
      psVar15[uVar11] = 0x7fffffff;
    }
    if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
        auVar23._12_4_ <= auVar21._12_4_) {
      psVar15[uVar11 + 1] = 0x7fffffff;
    }
    uVar11 = uVar11 + 2;
    lVar17 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 2;
    auVar22._8_8_ = lVar17 + 2;
  } while ((lVar18 + 1U & 0xfffffffffffffffe) != uVar11);
  *(converter->spseg_buffer).parent = 0;
  *psVar15 = 0;
  if (length != 0) {
    psVar15 = (converter->spseg_buffer).match_length;
    sVar6 = 0;
    do {
      sVar7 = dictionary_group_get_all_match_lengths
                        (converter->current_dictionary_group,*inbuf + sVar6,psVar15);
      psVar15 = (converter->spseg_buffer).match_length;
      if (*psVar15 != 1) {
        psVar15[sVar7] = 1;
        sVar7 = sVar7 + 1;
      }
      sVar1 = sVar6 + 1;
      if (sVar7 != 0) {
        sVar19 = 0;
        do {
          uVar11 = psVar15[sVar19];
          psVar15[sVar19] = 0;
          if (uVar11 < 2) {
            if (uVar11 == 1) {
              psVar16 = (converter->spseg_buffer).min_len;
              if (psVar16[sVar6] + 1 < psVar16[sVar1]) {
                psVar16[sVar1] = psVar16[sVar6] + 1;
                sVar20 = sVar1;
                goto LAB_00103dc2;
              }
            }
          }
          else {
            psVar16 = (converter->spseg_buffer).min_len;
            sVar20 = uVar11 + sVar6;
            if (psVar16[sVar6] + 1 <= psVar16[sVar20]) {
              psVar16[sVar20] = psVar16[sVar6] + 1;
LAB_00103dc2:
              (converter->spseg_buffer).parent[sVar20] = sVar6;
            }
          }
          sVar19 = sVar19 + 1;
        } while (sVar7 != sVar19);
      }
      sVar6 = sVar1;
    } while (sVar1 != length);
    psVar15 = (converter->spseg_buffer).min_len;
    psVar3 = (converter->spseg_buffer).parent;
    psVar16 = (converter->spseg_buffer).path + psVar15[length];
    sVar6 = length;
    do {
      psVar16 = psVar16 + -1;
      *psVar16 = sVar6;
      sVar6 = psVar3[sVar6];
    } while (sVar6 != 0);
  }
  sVar6 = *inbuf_left;
  sVar7 = sVar6;
  if (psVar15[length] != 0) {
    uVar11 = 0;
    sVar7 = 0;
    local_40 = inbuf_left;
    local_38 = inbuf;
    do {
      sVar1 = (converter->spseg_buffer).path[uVar11];
      ppuVar5 = dictionary_group_match_longest
                          (converter->current_dictionary_group,*inbuf,sVar1 - sVar7,&local_48);
      if (ppuVar5 == (ucs4_t **)0x0) {
        puVar13 = *outbuf;
        *puVar13 = **inbuf;
        *outbuf = puVar13 + 1;
        *outbuf_left = *outbuf_left - 1;
        *inbuf = *inbuf + 1;
        *inbuf_left = *inbuf_left - 1;
      }
      else {
        oVar2 = converter->conversion_mode;
        if (oVar2 == OPENCC_CONVERSION_FAST) {
          puVar13 = *ppuVar5;
          sVar7 = ucs4len(puVar13);
          uVar12 = *outbuf_left;
          if (uVar12 < sVar7) {
            sVar7 = *inbuf_left;
            if (sVar6 == sVar7) {
              errnum = CONVERTER_ERROR_OUTBUF;
              return 0xffffffffffffffff;
            }
            goto LAB_00104070;
          }
          uVar14 = *puVar13;
          if (uVar14 != 0) {
            puVar9 = *outbuf;
            do {
              puVar13 = puVar13 + 1;
              *puVar9 = uVar14;
              puVar9 = puVar9 + 1;
              uVar12 = uVar12 - 1;
              uVar14 = *puVar13;
            } while (uVar14 != 0);
            *outbuf = puVar9;
            *outbuf_left = uVar12;
          }
          *inbuf = *inbuf + local_48;
          *inbuf_left = *inbuf_left - local_48;
        }
        else if (oVar2 == OPENCC_CONVERSION_SEGMENT_ONLY) {
          uVar12 = *outbuf_left;
          if (uVar12 < local_48 + 1) {
            sVar7 = *inbuf_left;
            if (sVar6 == sVar7) {
              errnum = CONVERTER_ERROR_OUTBUF;
              return 0xffffffffffffffff;
            }
            goto LAB_00104070;
          }
          if (local_48 != 0) {
            puVar13 = *inbuf;
            sVar7 = local_48;
            do {
              puVar9 = *outbuf;
              *puVar9 = *puVar13;
              *outbuf = puVar9 + 1;
              *outbuf_left = *outbuf_left - 1;
              puVar13 = *inbuf + 1;
              *inbuf = puVar13;
              *inbuf_left = *inbuf_left - 1;
              sVar7 = sVar7 - 1;
            } while (sVar7 != 0);
            uVar12 = *outbuf_left;
          }
          puVar13 = *outbuf;
          *puVar13 = 0x20;
          *outbuf = puVar13 + 1;
          *outbuf_left = uVar12 - 1;
        }
        else {
          if (oVar2 != OPENCC_CONVERSION_LIST_CANDIDATES) {
            sp_seg_cold_1();
            goto LAB_0010420a;
          }
          puVar13 = *ppuVar5;
          if (puVar13 != (ucs4_t *)0x0) {
            lVar18 = 0;
            do {
              puVar9 = ppuVar5[lVar18 + 1];
              sVar7 = ucs4len(puVar13);
              uVar12 = *outbuf_left;
              if (uVar12 < (sVar7 + 1) - (ulong)(puVar9 == (ucs4_t *)0x0)) {
                if (sVar6 == *local_40) {
                  errnum = CONVERTER_ERROR_OUTBUF;
                  return 0xffffffffffffffff;
                }
                break;
              }
              uVar14 = *puVar13;
              if (uVar14 != 0) {
                puVar8 = *outbuf;
                do {
                  puVar13 = puVar13 + 1;
                  *puVar8 = uVar14;
                  puVar8 = puVar8 + 1;
                  uVar12 = uVar12 - 1;
                  uVar14 = *puVar13;
                } while (uVar14 != 0);
                *outbuf = puVar8;
                *outbuf_left = uVar12;
              }
              if (puVar9 != (ucs4_t *)0x0) {
                puVar13 = *outbuf;
                *puVar13 = 0x20;
                *outbuf = puVar13 + 1;
                *outbuf_left = uVar12 - 1;
              }
              lVar18 = lVar18 + 1;
              puVar13 = ppuVar5[lVar18];
            } while (puVar13 != (ucs4_t *)0x0);
          }
          *local_38 = *local_38 + local_48;
          *local_40 = *local_40 - local_48;
          inbuf = local_38;
          inbuf_left = local_40;
        }
      }
      uVar11 = uVar11 + 1;
      sVar7 = sVar1;
    } while (uVar11 < (converter->spseg_buffer).min_len[length]);
    sVar7 = *inbuf_left;
  }
LAB_00104070:
  return sVar6 - sVar7;
}

Assistant:

static size_t sp_seg(converter_desc * converter, ucs4_t ** inbuf, size_t * inbuf_left,
		ucs4_t ** outbuf, size_t * outbuf_left, size_t length)
{
	/* 最短路徑分詞 */
	
	/* 對長度爲1時特殊優化 */
	if (length == 1)
	{
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				1,
				NULL
		);
		
		size_t match_len = 1;
		if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				const ucs4_t * result = match_rs[0];

				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (ucs4len(result) > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				for (; *result; result ++)
				{
					**outbuf = *result;
					(*outbuf) ++,(*outbuf_left) --;
				}

				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				size_t i;
				for (i = 0; match_rs[i] != NULL; i ++)
				{
					const ucs4_t * result = match_rs[i];
					int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) + show_delimiter > *outbuf_left)
					{
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					if (show_delimiter)
					{
						**outbuf = DELIMITER;
						(*outbuf) ++, (*outbuf_left) --;
					}
				}
				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (match_len + 1 > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				size_t i;
				for (i = 0; i < match_len; i ++)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
			}
			**outbuf = DELIMITER;
			(*outbuf) ++, (*outbuf_left) --;
		}
		else
			debug_should_not_be_here();
		/* 必須保證有一個字符空間 */
		return match_len;
	}
	
	/* 設置緩衝區空間 */
	spseg_buffer_desc * ossb = &(converter->spseg_buffer);
	size_t buffer_size_need = length + 1;
	if (ossb->initialized == FALSE || ossb->buffer_size < buffer_size_need)
		sp_seg_set_buffer_size(&(converter->spseg_buffer), buffer_size_need);
	
	size_t i, j;

	for (i = 0; i <= length; i ++)
		ossb->min_len[i] = INFINITY_INT;
	
	ossb->min_len[0] = ossb->parent[0] = 0;
	
	for (i = 0; i < length; i ++)
	{
		/* 獲取所有匹配長度 */
		size_t match_count = dictionary_group_get_all_match_lengths(
				converter->current_dictionary_group,
				(*inbuf) + i,
				ossb->match_length
		);
		
		if (ossb->match_length[0] != 1)
			ossb->match_length[match_count ++] = 1;
		
		/* 動態規劃求最短分割路徑 */
		for (j = 0; j < match_count; j ++)
		{
			size_t k = ossb->match_length[j];
			ossb->match_length[j] = 0;
			
			if (k > 1 && ossb->min_len[i] + 1 <= ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
			else if (k == 1 && ossb->min_len[i] + 1 < ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
		}
	}
	
	/* 取得最短分割路徑 */
	for (i = length, j = ossb->min_len[length]; i != 0; i = ossb->parent[i])
		ossb->path[--j] = i;
	
	size_t inbuf_left_start = *inbuf_left;
	size_t begin, end;

	/* 根據最短分割路徑轉換 */
	for (i = begin = 0; i < ossb->min_len[length]; i ++)
	{
		end = ossb->path[i];
		
		size_t match_len;
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				end - begin,
				&match_len
		);

		if (match_rs == NULL)
		{
			**outbuf = **inbuf;
			(*outbuf) ++, (*outbuf_left) --;
			(*inbuf) ++, (*inbuf_left) --;
		}
		else
		{
			if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					const ucs4_t * result = match_rs[0];

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					size_t i;
					for (i = 0; match_rs[i] != NULL; i ++)
					{
						const ucs4_t * result = match_rs[i];
						int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

						/* 輸出緩衝區剩餘空間小於分詞長度 */
						if (ucs4len(result) + show_delimiter > *outbuf_left)
						{
							if (inbuf_left_start - *inbuf_left > 0)
								break;
							errnum = CONVERTER_ERROR_OUTBUF;
							return (size_t) -1;
						}

						for (; *result; result ++)
						{
							**outbuf = *result;
							(*outbuf) ++,(*outbuf_left) --;
						}

						if (show_delimiter)
						{
							**outbuf = DELIMITER;
							(*outbuf) ++, (*outbuf_left) --;
						}
					}
					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (match_len + 1 > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					size_t i;
					for (i = 0; i < match_len; i ++)
					{
						**outbuf = **inbuf;
						(*outbuf) ++, (*outbuf_left) --;
						(*inbuf) ++, (*inbuf_left) --;
					}
				}
				**outbuf = DELIMITER;
				(*outbuf) ++, (*outbuf_left) --;
			}
			else
				debug_should_not_be_here();
		}
		
		begin = end;
	}
	
	return inbuf_left_start - *inbuf_left;
}